

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O1

void __thiscall Renderer::UpdateWindowTitle(Renderer *this,int score,int fps)

{
  long *plVar1;
  undefined8 *puVar2;
  uint uVar3;
  long *plVar4;
  ulong *puVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  string __str_1;
  string title;
  string __str_2;
  string __str;
  ulong *local_138;
  long local_130;
  ulong local_128 [2];
  long *local_118;
  undefined8 local_110;
  long local_108;
  undefined8 uStack_100;
  long *local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  Renderer *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  uVar7 = -score;
  if (0 < score) {
    uVar7 = score;
  }
  uVar8 = 1;
  if (9 < uVar7) {
    uVar6 = (ulong)uVar7;
    uVar9 = 4;
    do {
      uVar8 = uVar9;
      uVar3 = (uint)uVar6;
      if (uVar3 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_00105e91;
      }
      if (uVar3 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_00105e91;
      }
      if (uVar3 < 10000) goto LAB_00105e91;
      uVar6 = uVar6 / 10000;
      uVar9 = uVar8 + 4;
    } while (99999 < uVar3);
    uVar8 = uVar8 + 1;
  }
LAB_00105e91:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar8 - (char)(score >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)score >> 0x1f) + (long)local_50[0]),uVar8,uVar7);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1083e7);
  local_78 = &local_68;
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_68 = *plVar4;
    lStack_60 = plVar1[3];
  }
  else {
    local_68 = *plVar4;
    local_78 = (long *)*plVar1;
  }
  local_70 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_78);
  puVar5 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar5) {
    local_a8 = *puVar5;
    lStack_a0 = plVar1[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *puVar5;
    local_b8 = (ulong *)*plVar1;
  }
  local_b0 = plVar1[1];
  *plVar1 = (long)puVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  uVar7 = -Mycontroller::highestScore;
  if (0 < Mycontroller::highestScore) {
    uVar7 = Mycontroller::highestScore;
  }
  uVar8 = 1;
  if (9 < uVar7) {
    uVar6 = (ulong)uVar7;
    uVar9 = 4;
    do {
      uVar8 = uVar9;
      uVar3 = (uint)uVar6;
      if (uVar3 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_00105fff;
      }
      if (uVar3 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_00105fff;
      }
      if (uVar3 < 10000) goto LAB_00105fff;
      uVar6 = uVar6 / 10000;
      uVar9 = uVar8 + 4;
    } while (99999 < uVar3);
    uVar8 = uVar8 + 1;
  }
LAB_00105fff:
  uVar9 = (uint)Mycontroller::highestScore >> 0x1f;
  local_138 = local_128;
  local_58 = this;
  std::__cxx11::string::_M_construct
            ((ulong)&local_138,(char)uVar8 - (char)(Mycontroller::highestScore >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)uVar9 + (long)local_138),uVar8,uVar7);
  uVar6 = 0xf;
  if (local_b8 != &local_a8) {
    uVar6 = local_a8;
  }
  if (uVar6 < (ulong)(local_130 + local_b0)) {
    uVar6 = 0xf;
    if (local_138 != local_128) {
      uVar6 = local_128[0];
    }
    if (uVar6 < (ulong)(local_130 + local_b0)) goto LAB_00106080;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_00106080:
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138);
  }
  local_118 = &local_108;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_108 = *plVar1;
    uStack_100 = puVar2[3];
  }
  else {
    local_108 = *plVar1;
    local_118 = (long *)*puVar2;
  }
  local_110 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_118);
  puVar5 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar5) {
    local_88 = *puVar5;
    lStack_80 = plVar1[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *puVar5;
    local_98 = (ulong *)*plVar1;
  }
  local_90 = plVar1[1];
  *plVar1 = (long)puVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  uVar7 = -fps;
  if (0 < fps) {
    uVar7 = fps;
  }
  uVar8 = 1;
  if (9 < uVar7) {
    uVar6 = (ulong)uVar7;
    uVar9 = 4;
    do {
      uVar8 = uVar9;
      uVar3 = (uint)uVar6;
      if (uVar3 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_001061a8;
      }
      if (uVar3 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_001061a8;
      }
      if (uVar3 < 10000) goto LAB_001061a8;
      uVar6 = uVar6 / 10000;
      uVar9 = uVar8 + 4;
    } while (99999 < uVar3);
    uVar8 = uVar8 + 1;
  }
LAB_001061a8:
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar8 - (char)(fps >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)fps >> 0x1f) + (long)local_d8),uVar8,uVar7);
  uVar6 = 0xf;
  if (local_98 != &local_88) {
    uVar6 = local_88;
  }
  if (uVar6 < (ulong)(local_d0 + local_90)) {
    uVar6 = 0xf;
    if (local_d8 != local_c8) {
      uVar6 = local_c8[0];
    }
    if ((ulong)(local_d0 + local_90) <= uVar6) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_98);
      goto LAB_00106245;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_d8);
LAB_00106245:
  local_f8 = &local_e8;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_e8 = *plVar1;
    uStack_e0 = puVar2[3];
  }
  else {
    local_e8 = *plVar1;
    local_f8 = (long *)*puVar2;
  }
  local_f0 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  SDL_SetWindowTitle(local_58->sdl_window,local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  return;
}

Assistant:

void Renderer::UpdateWindowTitle(int score, int fps) {
  std::string title{"Your Score: [" + std::to_string(score) + "]  highst score = ["+ std::to_string(Mycontroller::highestScore) + "] FPS: " + std::to_string(fps)};
  SDL_SetWindowTitle(sdl_window, title.c_str());
}